

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O1

bool slang::ast::hasSimpleLabel(StatementSyntax *syntax)

{
  SyntaxKind SVar1;
  
  if (syntax->label == (NamedLabelSyntax *)0x0) {
    return false;
  }
  SVar1 = (syntax->super_SyntaxNode).kind;
  if ((int)SVar1 < 0x15d) {
    if ((SVar1 != ForLoopStatement) && (SVar1 != ForeachLoopStatement)) {
      return true;
    }
  }
  else if (((SVar1 != ParallelBlockStatement) && (SVar1 != RandSequenceStatement)) &&
          (SVar1 != SequentialBlockStatement)) {
    return true;
  }
  return false;
}

Assistant:

static bool hasSimpleLabel(const StatementSyntax& syntax) {
    if (!syntax.label)
        return false;

    return syntax.kind != SyntaxKind::SequentialBlockStatement &&
           syntax.kind != SyntaxKind::ParallelBlockStatement &&
           syntax.kind != SyntaxKind::ForLoopStatement &&
           syntax.kind != SyntaxKind::ForeachLoopStatement &&
           syntax.kind != SyntaxKind::RandSequenceStatement;
}